

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

bool __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::step_push
          (xpath_ast_node *this,xpath_node_set_raw *ns,xml_attribute_struct *a,
          xml_node_struct *parent,xpath_allocator *alloc)

{
  bool bVar1;
  char *string;
  xml_node xStack_48;
  xml_attribute local_40;
  xpath_node local_38;
  
  if (a == (xml_attribute_struct *)0x0) {
    __assert_fail("a",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/pugixml/src/pugixml.cpp"
                  ,0x260f,
                  "bool pugi::impl::(anonymous namespace)::xpath_ast_node::step_push(xpath_node_set_raw &, xml_attribute_struct *, xml_node_struct *, xpath_allocator *)"
                 );
  }
  string = "";
  if (a->name != (char_t *)0x0) {
    string = a->name;
  }
  switch(this->_test) {
  case '\x01':
    bVar1 = strequal(string,(this->_data).string);
    break;
  case '\x02':
  case '\a':
    goto switchD_00180ec9_caseD_2;
  default:
    goto switchD_00180ec9_caseD_3;
  case '\b':
    bVar1 = starts_with(string,(this->_data).string);
  }
  if (bVar1 != false) {
switchD_00180ec9_caseD_2:
    bVar1 = is_xpath_attribute(string);
    if (bVar1) {
      xml_attribute::xml_attribute(&local_40,a);
      xml_node::xml_node(&xStack_48,parent);
      xpath_node::xpath_node(&local_38,&local_40,&xStack_48);
      xpath_node_set_raw::push_back(ns,&local_38,alloc);
      return true;
    }
  }
switchD_00180ec9_caseD_3:
  return false;
}

Assistant:

bool step_push(xpath_node_set_raw& ns, xml_attribute_struct* a, xml_node_struct* parent, xpath_allocator* alloc)
		{
			assert(a);

			const char_t* name = a->name ? a->name + 0 : PUGIXML_TEXT("");

			switch (_test)
			{
			case nodetest_name:
				if (strequal(name, _data.nodetest) && is_xpath_attribute(name))
				{
					ns.push_back(xpath_node(xml_attribute(a), xml_node(parent)), alloc);
					return true;
				}
				break;

			case nodetest_type_node:
			case nodetest_all:
				if (is_xpath_attribute(name))
				{
					ns.push_back(xpath_node(xml_attribute(a), xml_node(parent)), alloc);
					return true;
				}
				break;

			case nodetest_all_in_namespace:
				if (starts_with(name, _data.nodetest) && is_xpath_attribute(name))
				{
					ns.push_back(xpath_node(xml_attribute(a), xml_node(parent)), alloc);
					return true;
				}
				break;

			default:
				;
			}

			return false;
		}